

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O1

void __thiscall
torv3::Checksum(torv3 *this,Span<const_unsigned_char> addr_pubkey,uint8_t (*checksum) [2])

{
  long in_FS_OFFSET;
  Span<const_unsigned_char> data;
  Span<const_unsigned_char> data_00;
  Span<const_unsigned_char> data_01;
  Span<unsigned_char> output;
  uint8_t checksum_full [32];
  SHA3_256 hasher;
  undefined2 local_128 [20];
  SHA3_256 local_100;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_100,0,200);
  local_100.m_bufsize = 0;
  local_100.m_pos = 0;
  data.m_size = 0xf;
  data.m_data = ".onion checksum";
  SHA3_256::Write(&local_100,data);
  data_00.m_size = (size_t)addr_pubkey.m_data;
  data_00.m_data = (uchar *)this;
  SHA3_256::Write(&local_100,data_00);
  data_01.m_size = 1;
  data_01.m_data = "\x03";
  SHA3_256::Write(&local_100,data_01);
  output.m_size = 0x20;
  output.m_data = (uchar *)local_128;
  SHA3_256::Finalize(&local_100,output);
  *(undefined2 *)addr_pubkey.m_size = local_128[0];
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void Checksum(Span<const uint8_t> addr_pubkey, uint8_t (&checksum)[CHECKSUM_LEN])
{
    // TORv3 CHECKSUM = H(".onion checksum" | PUBKEY | VERSION)[:2]
    static const unsigned char prefix[] = ".onion checksum";
    static constexpr size_t prefix_len = 15;

    SHA3_256 hasher;

    hasher.Write(Span{prefix}.first(prefix_len));
    hasher.Write(addr_pubkey);
    hasher.Write(VERSION);

    uint8_t checksum_full[SHA3_256::OUTPUT_SIZE];

    hasher.Finalize(checksum_full);

    memcpy(checksum, checksum_full, sizeof(checksum));
}